

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall wasm::PassRunner::handleAfterEffects(PassRunner *this,Pass *pass,Function *func)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer puVar1;
  int iVar2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  pointer puVar3;
  
  iVar2 = (*pass->_vptr_Pass[6])(pass);
  if ((char)iVar2 != '\0') {
    if (func == (Function *)0x0) {
      iVar2 = (*pass->_vptr_Pass[4])(pass);
      if ((char)iVar2 != '\0') {
        __assert_fail("!pass->isFunctionParallel()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/pass.cpp"
                      ,0x413,"void wasm::PassRunner::handleAfterEffects(Pass *, Function *)");
      }
      puVar1 = (this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar3 = (this->wasm->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1
          ) {
        handleAfterEffects(this,pass,
                           (puVar3->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
    }
    else {
      iVar2 = (*pass->_vptr_Pass[8])();
      if ((char)iVar2 != '\0') {
        TypeUpdating::handleNonDefaultableLocals(func,this->wasm);
      }
      iVar2 = (*pass->_vptr_Pass[9])(pass);
      if ((char)iVar2 != '\0') {
        this_00 = (func->effects).
                  super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (func->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        (func->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void PassRunner::handleAfterEffects(Pass* pass, Function* func) {
  if (!pass->modifiesBinaryenIR()) {
    return;
  }

  // Binaryen IR is modified, so we may have work here.

  if (!func) {
    // If no function is provided, then this is not a function-parallel pass,
    // and it may have operated on any of the functions in theory, so run on
    // them all.
    assert(!pass->isFunctionParallel());
    for (auto& func : wasm->functions) {
      handleAfterEffects(pass, func.get());
    }
    return;
  }

  if (pass->requiresNonNullableLocalFixups()) {
    TypeUpdating::handleNonDefaultableLocals(func, *wasm);
  }

  if (pass->addsEffects()) {
    // Effects were added, so discard any computed effects for this function.
    func->effects.reset();
  }
}